

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

void __thiscall CppMLNN::check_gradient(CppMLNN *this,MatrixXd *examples,MatrixXd *labels)

{
  Index *other;
  pointer *this_00;
  double dVar1;
  RealScalar RVar2;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_00;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  ostream *poVar4;
  Index IVar5;
  reference this_01;
  Index IVar6;
  reference pvVar7;
  Scalar *pSVar8;
  double *pdVar9;
  double dVar10;
  RealScalar local_2b0;
  RealScalar local_2a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_2a0;
  double local_288;
  double J_minus;
  double local_268;
  double J_plus;
  undefined1 local_248 [8];
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A_1;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z_1;
  int j;
  int i;
  ConstantReturnType local_208;
  Matrix<double,_1,_1,0,_1,_1> local_1f0 [8];
  MatrixXd grad_compute;
  value_type grad_bp;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_1a8;
  undefined1 local_190 [8];
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  gradients;
  Matrix<double,__1,__1,_0,__1,__1> *theta;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_108;
  Matrix<double,__1,_1,_0,__1,_1> *b;
  Matrix<double,__1,__1,_0,__1,__1> *W;
  value_type *_model;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  model_cp;
  ConstBlockXpr local_c8;
  undefined1 local_90 [8];
  MatrixXd labels_batch;
  undefined1 local_40 [8];
  MatrixXd examples_batch;
  double epsilon;
  MatrixXd *labels_local;
  MatrixXd *examples_local;
  CppMLNN *this_local;
  
  examples_batch.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)std::pow<int,int>(10,-7);
  poVar4 = std::operator<<((ostream *)&std::cout,"espsilon:");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(double)examples_batch.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_cols);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&examples->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  other = &labels_batch.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
            ((ConstBlockXpr *)other,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)examples
             ,0,0,IVar5,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_40,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
              *)other);
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
            (&local_c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)labels,0,0,IVar5,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_90,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
              *)&local_c8);
  std::
  vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
            *)&_model,&this->m_model);
  this_01 = std::
            vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::back((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&_model);
  local_108 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this_01->second;
  b = (Matrix<double,__1,_1,_0,__1,_1> *)this_01;
  W = &this_01->first;
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01);
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)b);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01,IVar5,IVar6 + 1);
  pMVar3 = b;
  other_00 = local_108;
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)b);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)&theta,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pMVar3,
             IVar5 + -1);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&theta,other_00);
  pMVar3 = b;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&Z.
               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &A.
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)this_00);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)local_190);
  local_1a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::vector(&local_1a8);
  forward_propagation(this,(MatrixXd *)local_40,
                      (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)this_00,
                      (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)local_190,&local_1a8);
  std::
  vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::~vector(&local_1a8);
  back_propagation((MatrixXd *)
                   &grad_bp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,this,
                   (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&A.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_190,(MatrixXd *)local_90,
                   (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&Z.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &grad_bp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  pvVar7 = std::
           vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::front((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&Z.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &grad_compute.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,pvVar7);
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pMVar3);
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pMVar3);
  _j = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_208,IVar5,IVar6,(Scalar *)&j);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (local_1f0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_208);
  Z_1.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pMVar3);
    if (IVar5 <= Z_1.
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) break;
    Z_1.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    while( true ) {
      IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pMVar3);
      if (IVar5 <= (int)Z_1.
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&A_1.
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_248);
      IVar5 = examples_batch.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar3,
                          (long)Z_1.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (long)(int)Z_1.
                                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pSVar8 = *pSVar8 + (double)IVar5;
      std::
      vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&J_plus,
               (vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&_model);
      forward_propagation(this,(MatrixXd *)local_40,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&A_1.
                              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)local_248,
                          (vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&J_plus);
      std::
      vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::~vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&J_plus);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)&A_1.
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_268 = loss(this,pvVar7,(MatrixXd *)local_90);
      IVar5 = examples_batch.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar3,
                          (long)Z_1.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (long)(int)Z_1.
                                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pSVar8 = *pSVar8 - ((double)IVar5 + (double)IVar5);
      std::
      vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&J_minus,
               (vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&_model);
      forward_propagation(this,(MatrixXd *)local_40,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&A_1.
                              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)local_248,
                          (vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&J_minus);
      std::
      vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::~vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&J_minus);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)&A_1.
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_288 = loss(this,pvVar7,(MatrixXd *)local_90);
      dVar1 = local_268 - local_288;
      dVar10 = (double)examples_batch.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols +
               (double)examples_batch.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f0,
                          (long)Z_1.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (long)(int)Z_1.
                                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      IVar5 = examples_batch.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      *pSVar8 = dVar1 / dVar10;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar3,
                          (long)Z_1.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (long)(int)Z_1.
                                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pSVar8 = (double)IVar5 + *pSVar8;
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_248);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&A_1.
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Z_1.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)Z_1.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    }
    Z_1.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Z_1.
         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"difference: ");
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            (&local_2a0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1f0,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &grad_compute.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_2a0);
  local_2a8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0);
  local_2b0 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         &grad_compute.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols);
  pdVar9 = std::max<double>(&local_2a8,&local_2b0);
  std::ostream::operator<<(poVar4,RVar2 / *pdVar9);
  exit(0);
}

Assistant:

void CppMLNN::check_gradient(const MatrixXd& examples, const MatrixXd& labels) {
	double epsilon = pow(10, -7);
	cout << "espsilon:" << epsilon << endl;

	MatrixXd examples_batch = examples.block(0, 0, examples.rows(), 2);
	MatrixXd labels_batch = labels.block(0, 0, labels.rows(), 2);

	auto model_cp = m_model;
	auto& _model = model_cp.back();
	auto& W = _model.first;
	auto& b = _model.second;
	W.conservativeResize(W.rows(), W.cols() + 1);
	W.col(W.cols() - 1) = b;
	auto& theta = W;

	vector<MatrixXd> gradients, Z, A;
	forward_propagation(examples_batch, Z, A);
	back_propagation(Z, A, labels_batch, gradients);
	auto grad_bp = gradients.front();

	MatrixXd grad_compute = MatrixXd::Constant(theta.rows(), theta.cols(), 0);
	for (int i = 0; i < theta.rows(); i++) {
		for (int j = 0; j < theta.cols(); j++) {
			vector<MatrixXd> Z, A;
			theta(i, j) += epsilon;
			forward_propagation(examples_batch, Z, A, model_cp);
			auto J_plus = loss(Z.back(), labels_batch);

			theta(i, j) -= 2 * epsilon;
			forward_propagation(examples_batch, Z, A, model_cp);
			auto J_minus = loss(Z.back(), labels_batch);

			grad_compute(i,j) = (J_plus - J_minus) / (2 * epsilon);

			theta(i, j) += epsilon;
		}
	}

	cout << "difference: " << (grad_compute - grad_bp).norm() / max(grad_compute.norm(), grad_bp.norm());

	exit(0);
}